

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_transaction.cpp
# Opt level: O2

void __thiscall
cfdcapi_transaction_VerifySignature_Test::~cfdcapi_transaction_VerifySignature_Test
          (cfdcapi_transaction_VerifySignature_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(cfdcapi_transaction, VerifySignature) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  // p2wpkh
  ret = CfdVerifySignature(
      handle, kCfdNetworkMainnet,
      "0100000001aca6c902e9569c99e172c22182f943e4ab15f28602ab248f65c864874a9ddc860000000000ffffffff01005ed0b20000000017a914eca3232c3a28a4d0c03b374d0f6053e9e546e9978700000000",
      "772fe60c82f16e05ce9e5411bb3666f7366f327233af611ed6a4067f23248a865d111f26e2b5306df6dade2524589ce868c0c0468359ed385c9ff3d79c600549",
      kCfdP2wpkh,
      "02f56451fc1fd9040652ff9a700cf914ad1df1c8f9e82f3fe96ca01b6cd47293ef",
      nullptr,
      "86dc9d4a8764c8658f24ab0286f215abe443f98221c272e1999c56e902c9a6ac", 0,
      kCfdSigHashAll, false, int64_t{3000002000}, nullptr);
  EXPECT_EQ(kCfdSuccess, ret);

  // p2pkh
  ret = CfdVerifySignature(
      handle, kCfdNetworkMainnet,
      "01000000019c53cb2a6118530aaa345b799aeb7e4e5055de41ac5b2dd2ce47419624c57b580000000000ffffffff0130ea052a010000001976a9143cadb10040e9e7002bbd9d0620f5f79c05603ffd88ac00000000",
      "3c1cffcc8908ab1911303f102c41e5c677488346851288360b0d309ab99557207ac2c9c6aec9d8bae187a1eea843dda423edff216c568efad231e4249c77ffe1",
      kCfdP2pkh,
      "02f56451fc1fd9040652ff9a700cf914ad1df1c8f9e82f3fe96ca01b6cd47293ef",
      nullptr,
      "587bc524964147ced22d5bac41de55504e7eeb9a795b34aa0a5318612acb539c", 0,
      kCfdSigHashAll, false, int64_t{1000}, nullptr);
  EXPECT_EQ(kCfdSuccess, ret);

  // p2wpkh: fail
  ret = CfdVerifySignature(
      handle, kCfdNetworkMainnet,
      "0100000001aca6c902e9569c99e172c22182f943e4ab15f28602ab248f65c864874a9ddc860000000000ffffffff01005ed0b20000000017a914eca3232c3a28a4d0c03b374d0f6053e9e546e9978700000000",
      "772fe60c82f16e05ce9e5411bb8666f7366f327233af611ed6a4067f23248a865d111f26e2b5306df6dade2524589ce868c0c0468359ed385c9ff3d79c600549",
      kCfdP2wpkh,
      "02f56451fc1fd9040652ff9a700cf914ad1df1c8f9e82f3fe96ca01b6cd47293ef",
      nullptr,
      "86dc9d4a8764c8658f24ab0286f215abe443f98221c272e1999c56e902c9a6ac", 0,
      kCfdSigHashAll, false, int64_t{3000002000}, nullptr);
  EXPECT_EQ(kCfdSignVerificationError, ret);

  // p2wsh
  ret = CfdVerifySignature(
      handle, kCfdNetworkMainnet,
      "0100000002fe3dc9208094f3ffd12645477b3dc56f60ec4fa8e6f5d67c565d1c6b9216b36e0000000000ffffffff0815cf020f013ed6cf91d29f4202e8a58726b1ac6c79da47c23d1bee0a6925f80000000000ffffffff0100f2052a010000001976a914a30741f8145e5acadf23f751864167f32e0963f788ac00000000",
      "27dc95ad6b740fe5129e7e62a75dd00f291a2aeb1200b84b09d9e3789406b6c01a9ecd315dd6a0e632ab20bbb98948bc0c6fb204f2c286963bb48517a7058e27",
      kCfdP2wsh,
      "026dccc749adc2a9d0d89497ac511f760f45c47dc5ed9cf352a58ac706453880ae",
      "21026dccc749adc2a9d0d89497ac511f760f45c47dc5ed9cf352a58ac706453880aeadab210255a9626aebf5e29c0e6538428ba0d1dcf6ca98ffdf086aa8ced5e0d0215ea465ac",
      "f825690aee1b3dc247da796cacb12687a5e802429fd291cfd63e010f02cf1508", 0,
      kCfdSigHashSingle, false, int64_t{4900000000}, nullptr);
  EXPECT_EQ(kCfdSuccess, ret);

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}